

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

void flush(NMQ *q)

{
  NMQ *q_local;
  
  window_probe_req2peer_if_need(q);
  acks2peer(q);
  sndq2buf(q);
  flush_snd_buf(q);
  rcvbuf2q(q);
  window_probe_build_req_if_need(q);
  check_send_done(q);
  return;
}

Assistant:

static void flush(NMQ *q) {

    window_probe_req2peer_if_need(q);

    acks2peer(q);

    sndq2buf(q);

    flush_snd_buf(q);

    rcvbuf2q(q);

    window_probe_build_req_if_need(q);

    check_send_done(q);
}